

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask6_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 6 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 0xc | uVar1;
  *out = uVar1;
  uVar1 = in[3] << 0x12 | uVar1;
  *out = uVar1;
  uVar1 = in[4] << 0x18 | uVar1;
  *out = uVar1;
  uVar2 = in[5];
  *out = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[1] = uVar2;
  uVar2 = in[6] << 4 | uVar2;
  out[1] = uVar2;
  out[1] = in[7] << 10 | uVar2;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask6_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (6 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 10;
  ++in;

  return out + 1;
}